

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

Relations dg::vr::ValueRelations::compare(C lt,C rt)

{
  int64_t iVar1;
  int64_t iVar2;
  _Base_bitset<1UL> *p_Var3;
  Relations result;
  _Base_bitset<1UL> local_18;
  
  if (*(int *)(lt + 0x20) == 1) {
    if (*(int *)(rt + 0x20) == 1) {
LAB_00140bb5:
      iVar1 = llvm::APInt::getSExtValue((APInt *)(lt + 0x18));
      iVar2 = llvm::APInt::getSExtValue((APInt *)(rt + 0x18));
      local_18._M_w = 0;
      if (iVar1 < iVar2) {
        Relations::slt((Relations *)&local_18);
      }
      else if (iVar2 < iVar1) {
        Relations::sgt((Relations *)&local_18);
      }
      else {
        Relations::eq((Relations *)&local_18);
      }
      p_Var3 = (_Base_bitset<1UL> *)dg::vr::Relations::addImplied();
      return (Relations)p_Var3->_M_w;
    }
  }
  else if (*(int *)(rt + 0x20) != 1) goto LAB_00140bb5;
  return (Relations)0;
}

Assistant:

Relations ValueRelations::compare(C lt, C rt) {
    // ignore bool values
    if ((lt->getBitWidth() == 1 || rt->getBitWidth() == 1) &&
        lt->getBitWidth() != rt->getBitWidth())
        return {};
    int64_t isLt = lt->getSExtValue();
    int64_t isRt = rt->getSExtValue();
    Relations result;
    if (isLt < isRt)
        result.slt();
    else if (isLt > isRt)
        result.sgt();
    else
        result.eq();

    // possible to collect unsigned relations between constants here

    return result.addImplied();
}